

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroup.h
# Opt level: O3

SamReadGroup * __thiscall
BamTools::SamReadGroup::operator=(SamReadGroup *this,SamReadGroup *param_1)

{
  pointer pCVar1;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> local_28;
  
  std::__cxx11::string::operator=((string *)this,(string *)param_1);
  std::__cxx11::string::operator=((string *)&this->FlowOrder,(string *)&param_1->FlowOrder);
  std::__cxx11::string::operator=((string *)&this->ID,(string *)&param_1->ID);
  std::__cxx11::string::operator=((string *)&this->KeySequence,(string *)&param_1->KeySequence);
  std::__cxx11::string::operator=((string *)&this->Library,(string *)&param_1->Library);
  std::__cxx11::string::operator=((string *)&this->PlatformUnit,(string *)&param_1->PlatformUnit);
  std::__cxx11::string::operator=
            ((string *)&this->PredictedInsertSize,(string *)&param_1->PredictedInsertSize);
  std::__cxx11::string::operator=
            ((string *)&this->ProductionDate,(string *)&param_1->ProductionDate);
  std::__cxx11::string::operator=((string *)&this->Program,(string *)&param_1->Program);
  std::__cxx11::string::operator=((string *)&this->Sample,(string *)&param_1->Sample);
  std::__cxx11::string::operator=
            ((string *)&this->SequencingCenter,(string *)&param_1->SequencingCenter);
  std::__cxx11::string::operator=
            ((string *)&this->SequencingTechnology,(string *)&param_1->SequencingTechnology);
  local_28.super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->CustomTags).
       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pCVar1 = (param_1->CustomTags).
           super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->CustomTags).
       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_28.super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->CustomTags).
       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->CustomTags).
       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = pCVar1;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->CustomTags).
       super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::~vector
            (&local_28);
  return this;
}

Assistant:

struct API_EXPORT SamReadGroup
{

    // ctor & dtor
    SamReadGroup();
    SamReadGroup(const std::string& id);

    // query/modify entire read group
    void Clear();  // clears all data fields

    // convenience query methods
    bool HasDescription() const;          // returns true if read group has a description
    bool HasFlowOrder() const;            // returns true if read group has a flow order entry
    bool HasID() const;                   // returns true if read group has a group ID
    bool HasKeySequence() const;          // returns true if read group has a key sequence
    bool HasLibrary() const;              // returns true if read group has a library name
    bool HasPlatformUnit() const;         // returns true if read group has a platform unit ID
    bool HasPredictedInsertSize() const;  // returns true if read group has a predicted insert size
    bool HasProductionDate() const;       // returns true if read group has a production date
    bool HasProgram() const;              // returns true if read group has a program entry
    bool HasSample() const;               // returns true if read group has a sample name
    bool HasSequencingCenter() const;     // returns true if read group has a sequencing center ID
    bool HasSequencingTechnology()
        const;  // returns true if read group has a sequencing technology ID

    // data fields
    std::string Description;           // DS:<Description>
    std::string FlowOrder;             // FO:<FlowOrder>
    std::string ID;                    // ID:<ID>              *Required for valid SAM header*
    std::string KeySequence;           // KS:<KeySequence>
    std::string Library;               // LB:<Library>
    std::string PlatformUnit;          // PU:<PlatformUnit>
    std::string PredictedInsertSize;   // PI:<PredictedInsertSize>
    std::string ProductionDate;        // DT:<ProductionDate>
    std::string Program;               // PG:<Program>
    std::string Sample;                // SM:<Sample>
    std::string SequencingCenter;      // CN:<SequencingCenter>
    std::string SequencingTechnology;  // PL:<SequencingTechnology>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags
}